

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exactfloat.cc
# Opt level: O1

ExactFloat __thiscall
ExactFloat::SignedSum(ExactFloat *this,int a_sign,ExactFloat *a,int b_sign,ExactFloat *b)

{
  BIGNUM *a_00;
  BIGNUM *b_00;
  int iVar1;
  BIGNUM *pBVar2;
  int iVar3;
  BIGNUM *extraout_RDX;
  BIGNUM *extraout_RDX_00;
  BIGNUM *extraout_RDX_01;
  BIGNUM *extraout_RDX_02;
  ExactFloat *r;
  ExactFloat *pEVar5;
  int iVar6;
  bool bVar7;
  ExactFloat EVar8;
  int local_44;
  S2LogMessage local_40;
  BigNum BVar4;
  
  iVar3 = a->bn_exp_;
  if ((0x7ffffffc < iVar3) || (0x7ffffffc < b->bn_exp_)) {
    pEVar5 = a;
    if ((iVar3 == 0x7fffffff) || (iVar6 = b->bn_exp_, pEVar5 = b, iVar6 == 0x7fffffff)) {
      ExactFloat(this,pEVar5);
      BVar4.bn_ = extraout_RDX;
    }
    else {
      if (iVar3 == 0x7ffffffe) {
        bVar7 = a_sign != b_sign;
        b_sign = a_sign;
        if (bVar7 && iVar6 == 0x7ffffffe) {
          EVar8 = NaN();
          BVar4 = EVar8.bn_.bn_;
          goto LAB_00238b2e;
        }
      }
      else if (iVar6 != 0x7ffffffe) {
        if (iVar3 == 0x7ffffffd) {
          if (iVar6 == 0x7ffffffd) {
            if (a_sign != b_sign) {
              a_sign = 1;
            }
            EVar8 = SignedZero(this,a_sign);
            BVar4 = EVar8.bn_.bn_;
          }
          else {
            ExactFloat(this,b);
            this->sign_ = b_sign;
            BVar4.bn_ = extraout_RDX_02;
          }
        }
        else {
          if (iVar6 != 0x7ffffffd) {
            S2LogMessage::S2LogMessage
                      (&local_40,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/math/exactfloat/exactfloat.cc"
                       ,0x21f,kFatal,(ostream *)&std::cerr);
            std::__ostream_insert<char,std::char_traits<char>>
                      (local_40.stream_,"Check failed: b->is_zero() ",0x1b);
            goto LAB_00238bee;
          }
          ExactFloat(this,a);
          this->sign_ = a_sign;
          BVar4.bn_ = extraout_RDX_01;
        }
        goto LAB_00238b2e;
      }
      EVar8 = Infinity(this,b_sign);
      BVar4 = EVar8.bn_.bn_;
    }
    goto LAB_00238b2e;
  }
  pEVar5 = b;
  iVar6 = a_sign;
  local_44 = b_sign;
  if (iVar3 < b->bn_exp_) {
    pEVar5 = a;
    a = b;
    iVar6 = b_sign;
    local_44 = a_sign;
  }
  this->sign_ = 1;
  this->bn_exp_ = 0x7ffffffd;
  pBVar2 = BN_new();
  (this->bn_).bn_ = (BIGNUM *)pBVar2;
  iVar3 = a->bn_exp_ - pEVar5->bn_exp_;
  if ((iVar3 != 0 && pEVar5->bn_exp_ <= a->bn_exp_) &&
     (iVar3 = BN_lshift(pBVar2,(BIGNUM *)(a->bn_).bn_,iVar3), a = this, iVar3 == 0)) {
    S2LogMessage::S2LogMessage
              (&local_40,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/math/exactfloat/exactfloat.cc"
               ,0x22b,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_40.stream_,
               "Check failed: BN_lshift(r.bn_.get(), a->bn_.get(), a->bn_exp_ - b->bn_exp_) ",0x4c);
LAB_00238bee:
    abort();
  }
  this->bn_exp_ = pEVar5->bn_exp_;
  pBVar2 = (BIGNUM *)(this->bn_).bn_;
  a_00 = (BIGNUM *)(a->bn_).bn_;
  b_00 = (BIGNUM *)(pEVar5->bn_).bn_;
  if (b_sign == a_sign) {
    iVar1 = BN_add(pBVar2,a_00,b_00);
    iVar3 = iVar6;
    if (iVar1 == 0) {
      S2LogMessage::S2LogMessage
                (&local_40,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/math/exactfloat/exactfloat.cc"
                 ,0x230,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_40.stream_,"Check failed: BN_add(r.bn_.get(), a->bn_.get(), b->bn_.get()) ",
                 0x3e);
      goto LAB_00238bee;
    }
LAB_00238a93:
    this->sign_ = iVar3;
  }
  else {
    iVar3 = BN_sub(pBVar2,a_00,b_00);
    if (iVar3 == 0) {
      S2LogMessage::S2LogMessage
                (&local_40,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/math/exactfloat/exactfloat.cc"
                 ,0x236,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_40.stream_,"Check failed: BN_sub(r.bn_.get(), a->bn_.get(), b->bn_.get()) ",
                 0x3e);
      goto LAB_00238bee;
    }
    iVar1 = BN_is_zero((this->bn_).bn_);
    iVar3 = 1;
    if ((iVar1 != 0) || (iVar1 = BN_is_negative((this->bn_).bn_), iVar3 = iVar6, iVar1 == 0))
    goto LAB_00238a93;
    this->sign_ = local_44;
    BN_set_negative((BIGNUM *)(this->bn_).bn_,0);
  }
  Canonicalize(this);
  BVar4.bn_ = extraout_RDX_00;
LAB_00238b2e:
  EVar8.bn_.bn_ = BVar4.bn_;
  EVar8._0_8_ = this;
  return EVar8;
}

Assistant:

ExactFloat ExactFloat::SignedSum(int a_sign, const ExactFloat* a,
                                 int b_sign, const ExactFloat* b) {
  if (!a->is_normal() || !b->is_normal()) {
    // Handle zero, infinity, and NaN according to IEEE 754-2008.
    if (a->is_nan()) return *a;
    if (b->is_nan()) return *b;
    if (a->is_inf()) {
      // Adding two infinities with opposite sign yields NaN.
      if (b->is_inf() && a_sign != b_sign) return NaN();
      return Infinity(a_sign);
    }
    if (b->is_inf()) return Infinity(b_sign);
    if (a->is_zero()) {
      if (!b->is_zero()) return b->CopyWithSign(b_sign);
      // Adding two zeros with the same sign preserves the sign.
      if (a_sign == b_sign) return SignedZero(a_sign);
      // Adding two zeros of opposite sign produces +0.
      return SignedZero(+1);
    }
    S2_DCHECK(b->is_zero());
    return a->CopyWithSign(a_sign);
  }
  // Swap the numbers if necessary so that "a" has the larger bn_exp_.
  if (a->bn_exp_ < b->bn_exp_) {
    using std::swap;
    swap(a_sign, b_sign);
    swap(a, b);
  }
  // Shift "a" if necessary so that both values have the same bn_exp_.
  ExactFloat r;
  if (a->bn_exp_ > b->bn_exp_) {
    S2_CHECK(BN_lshift(r.bn_.get(), a->bn_.get(), a->bn_exp_ - b->bn_exp_));
    a = &r;  // The only field of "a" used below is bn_.
  }
  r.bn_exp_ = b->bn_exp_;
  if (a_sign == b_sign) {
    S2_CHECK(BN_add(r.bn_.get(), a->bn_.get(), b->bn_.get()));
    r.sign_ = a_sign;
  } else {
    // Note that the BIGNUM documentation is out of date -- all methods now
    // allow the result to be the same as any input argument, so it is okay if
    // (a == &r) due to the shift above.
    S2_CHECK(BN_sub(r.bn_.get(), a->bn_.get(), b->bn_.get()));
    if (BN_is_zero(r.bn_.get())) {
      r.sign_ = +1;
    } else if (BN_is_negative(r.bn_.get())) {
      // The magnitude of "b" was larger.
      r.sign_ = b_sign;
      BN_set_negative(r.bn_.get(), false);
    } else {
      // They were equal, or the magnitude of "a" was larger.
      r.sign_ = a_sign;
    }
  }
  r.Canonicalize();
  return r;
}